

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O3

void rprog_set(ROOM_INDEX_DATA *room,char *progtype,char *name)

{
  RPROG_DATA *pRVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  long lVar5;
  improg_type *piVar6;
  string_view fmt;
  string_view fmt_00;
  
  bVar3 = str_cmp("pulse_prog_cimar_sewergrate",name);
  if (bVar3) {
    lVar2 = 0;
    do {
      lVar5 = lVar2;
      if (lVar5 + 0x20 == 0x220) {
        fmt._M_str = "Load_improgs: \'R\': Function not found for vnum {}";
        fmt._M_len = 0x31;
        CLogger::Warn<short&>((CLogger *)&RS.field_0x140,fmt,&room->vnum);
        return;
      }
      bVar3 = str_cmp(*(char **)((long)&rprog_table[1].name + lVar5),name);
      lVar2 = lVar5 + 0x20;
    } while (bVar3);
    piVar6 = (improg_type *)((long)&rprog_table[1].type + lVar5);
  }
  else {
    piVar6 = rprog_table;
  }
  bVar3 = str_cmp(progtype,"pulse_prog");
  if (bVar3) {
    bVar3 = str_cmp(progtype,"entry_prog");
    if (bVar3) {
      bVar3 = str_cmp(progtype,"move_prog");
      if (bVar3) {
        bVar3 = str_cmp(progtype,"drop_prog");
        if (bVar3) {
          bVar3 = str_cmp(progtype,"speech_prog");
          if (bVar3) {
            bVar3 = str_cmp(progtype,"open_prog");
            if (bVar3) {
              fmt_00._M_str = "Load_improgs: \'R\': invalid program type for vnum {}";
              fmt_00._M_len = 0x33;
              CLogger::Error<short&>((CLogger *)&RS.field_0x140,fmt_00,&room->vnum);
              exit(1);
            }
            pRVar1 = room->rprogs;
            pRVar1->open_prog = (RPROG_FUN_OPEN *)piVar6->function;
            free_pstring(pRVar1->open_name);
            pcVar4 = palloc_string(name);
            room->rprogs->open_name = pcVar4;
            *(byte *)room->progtypes = (byte)room->progtypes[0] | 0x20;
          }
          else {
            pRVar1 = room->rprogs;
            pRVar1->speech_prog = (RPROG_FUN_SPEECH *)piVar6->function;
            free_pstring(pRVar1->speech_name);
            pcVar4 = palloc_string(name);
            room->rprogs->speech_name = pcVar4;
            *(byte *)room->progtypes = (byte)room->progtypes[0] | 0x10;
          }
        }
        else {
          pRVar1 = room->rprogs;
          pRVar1->drop_prog = (RPROG_FUN_DROP *)piVar6->function;
          free_pstring(pRVar1->drop_name);
          pcVar4 = palloc_string(name);
          room->rprogs->drop_name = pcVar4;
          *(byte *)room->progtypes = (byte)room->progtypes[0] | 8;
        }
      }
      else {
        pRVar1 = room->rprogs;
        pRVar1->move_prog = (RPROG_FUN_MOVE *)piVar6->function;
        free_pstring(pRVar1->move_name);
        pcVar4 = palloc_string(name);
        room->rprogs->move_name = pcVar4;
        *(byte *)room->progtypes = (byte)room->progtypes[0] | 4;
      }
    }
    else {
      pRVar1 = room->rprogs;
      pRVar1->entry_prog = (RPROG_FUN_ENTRY *)piVar6->function;
      free_pstring(pRVar1->entry_name);
      pcVar4 = palloc_string(name);
      room->rprogs->entry_name = pcVar4;
      *(byte *)room->progtypes = (byte)room->progtypes[0] | 2;
    }
  }
  else {
    pRVar1 = room->rprogs;
    pRVar1->pulse_prog = (RPROG_FUN_PULSE *)piVar6->function;
    free_pstring(pRVar1->pulse_name);
    pcVar4 = palloc_string(name);
    room->rprogs->pulse_name = pcVar4;
    *(byte *)room->progtypes = (byte)room->progtypes[0] | 1;
  }
  return;
}

Assistant:

void rprog_set(ROOM_INDEX_DATA *room, const char *progtype, const char *name)
{
	int i;

	for (i = 0; rprog_table[i].name; i++)
	{
		if (!str_cmp(rprog_table[i].name, name))
			break;
	}

	if (!rprog_table[i].name)
	{
		RS.Logger.Warn("Load_improgs: 'R': Function not found for vnum {}", room->vnum);
		return;
	}

	// IF YOU ADD A NEW TYPE ALSO PUT IT IN DB.C DO_ADUMP
	if (!str_cmp(progtype, "pulse_prog"))
	{
		room->rprogs->pulse_prog = (RPROG_FUN_PULSE *)rprog_table[i].function;
		free_pstring(room->rprogs->pulse_name);
		room->rprogs->pulse_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_PULSE);
		return;
	}

	if (!str_cmp(progtype, "entry_prog"))
	{
		room->rprogs->entry_prog = (RPROG_FUN_ENTRY *)rprog_table[i].function;
		free_pstring(room->rprogs->entry_name);
		room->rprogs->entry_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_ENTRY);
		return;
	}

	if (!str_cmp(progtype, "move_prog"))
	{
		room->rprogs->move_prog = (RPROG_FUN_MOVE *)rprog_table[i].function;

		if (room->progtypes)
			free_pstring(room->rprogs->move_name);

		room->rprogs->move_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_MOVE);
		return;
	}

	if (!str_cmp(progtype, "drop_prog"))
	{
		room->rprogs->drop_prog = (RPROG_FUN_DROP *)rprog_table[i].function;
		free_pstring(room->rprogs->drop_name);
		room->rprogs->drop_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_DROP);
		return;
	}

	if (!str_cmp(progtype, "speech_prog"))
	{
		room->rprogs->speech_prog = (RPROG_FUN_SPEECH *)rprog_table[i].function;
		free_pstring(room->rprogs->speech_name);
		room->rprogs->speech_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_SPEECH);
		return;
	}

	if (!str_cmp(progtype, "open_prog"))
	{
		room->rprogs->open_prog = (RPROG_FUN_OPEN *)rprog_table[i].function;
		free_pstring(room->rprogs->open_name);
		room->rprogs->open_name = palloc_string(name);
		SET_BIT(room->progtypes, RPROG_OPEN);
		return;
	}

	RS.Logger.Error("Load_improgs: 'R': invalid program type for vnum {}", room->vnum);
	exit(1);
}